

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O1

void do_specialize(CHAR_DATA *ch,char *argument)

{
  short *psVar1;
  long *plVar2;
  PC_DATA *pPVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  CClass *this;
  ulong uVar8;
  int iVar9;
  char *txt;
  long lVar10;
  double dVar11;
  char buf [4608];
  char acStack_1238 [4616];
  
  bVar5 = is_npc(ch);
  if (bVar5) {
    return;
  }
  this = ch->my_class;
  if ((this == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
    this = CClass::GetClass(0);
  }
  iVar6 = CClass::GetIndex(this);
  if (iVar6 == 1) {
    bVar5 = str_cmp(argument,"");
    if (!bVar5) {
      send_to_char("You can choose from the following specializations:\n\r",ch);
      lVar10 = 0x18;
      do {
        uVar4 = *(ulong *)((long)&sphere_table[0x12].name + lVar10);
        uVar8 = uVar4 + 0x1f;
        if (-1 < (long)uVar4) {
          uVar8 = uVar4;
        }
        uVar8 = ch->pcdata->styles[(int)(uVar8 >> 5)];
        dVar11 = exp2((double)((long)uVar4 % 0x20));
        if ((uVar8 & (long)dVar11) == 0) {
          send_to_char(*(char **)((long)&style_table[0].bit + lVar10),ch);
          send_to_char("\n\r",ch);
        }
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x78);
      return;
    }
    if (ch->pcdata->special == 0) {
      txt = "You have no available specializations.\n\r";
    }
    else {
      iVar6 = 1;
      lVar10 = 0x18;
      do {
        bVar5 = str_prefix(argument,*(char **)((long)&style_table[0].bit + lVar10));
        if (!bVar5) goto LAB_0032f30d;
        iVar6 = iVar6 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x78);
      iVar6 = 0;
LAB_0032f30d:
      if (iVar6 != 0) {
        dVar11 = exp2((double)(style_table[iVar6].bit % 0x20));
        pPVar3 = ch->pcdata;
        iVar7 = (int)style_table[iVar6].bit;
        iVar9 = iVar7 + 0x1f;
        if (-1 < iVar7) {
          iVar9 = iVar7;
        }
        plVar2 = pPVar3->styles + (iVar9 >> 5);
        *plVar2 = *plVar2 | (long)dVar11;
        psVar1 = &pPVar3->special;
        *psVar1 = *psVar1 + -1;
        sprintf(acStack_1238,"You are now specialized in the %s fighting style.\n\r",
                style_table[iVar6].name);
        send_to_char(acStack_1238,ch);
        group_add(ch,style_table[iVar6].name,false);
        pPVar3 = ch->pcdata;
        iVar7 = skill_lookup(style_table[iVar6].name);
        pPVar3->learned[iVar7] = 2;
        if (ch->pcdata->style != 0) {
          return;
        }
        ch->pcdata->style = (short)iVar6;
        return;
      }
      txt = "That\'s not a valid style to specialize in.\n\r";
    }
  }
  else {
    txt = "Huh?\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_specialize(CHAR_DATA *ch, char *argument)
{
	int i, style = 0;
	char buf[MSL];

	if (is_npc(ch))
		return;

	if (ch->Class()->GetIndex() != CLASS_WARRIOR)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (!str_cmp(argument, ""))
	{
		send_to_char("You can choose from the following specializations:\n\r", ch);

		for (i = 1; i < MAX_STYLE; i++)
		{
			if (!IS_SET(ch->pcdata->styles, style_table[i].bit))
			{
				send_to_char(style_table[i].name, ch);
				send_to_char("\n\r", ch);
			}
		}

		return;
	}

	if (!ch->pcdata->special)
	{
		send_to_char("You have no available specializations.\n\r", ch);
		return;
	}

	style = style_lookup(argument);

	if (!style)
	{
		send_to_char("That's not a valid style to specialize in.\n\r", ch);
		return;
	}

	SET_BIT(ch->pcdata->styles, style_table[style].bit);
	ch->pcdata->special--;

	sprintf(buf, "You are now specialized in the %s fighting style.\n\r", style_table[style].name);
	send_to_char(buf, ch);

	group_add(ch, style_table[style].name, false);

	ch->pcdata->learned[skill_lookup(style_table[style].name)] = 2;

	if (ch->pcdata->style == 0)
		ch->pcdata->style = style;
}